

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitSum
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,SumExpr e)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  bool bVar1;
  iterator this_00;
  iterator other;
  ExprBase EVar2;
  BasicWriter<char> *in_RDI;
  iterator end;
  iterator i;
  Buffer<char> *in_stack_ffffffffffffff88;
  Buffer<char> *this_01;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> EVar3;
  ExprBase in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI->buffer_;
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_RDI,(char *)in_stack_ffffffffffffff88);
  value.size_ = in_stack_ffffffffffffffc0;
  value.data_ = in_stack_ffffffffffffffb8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value);
  this_00 = BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
            ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                     *)in_stack_ffffffffffffff88);
  other = BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          ::end((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                 *)this_01);
  bVar1 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator!=
                    ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                     &stack0xffffffffffffffd8,
                     (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)other.ptr_
                    );
  if (bVar1) {
    EVar2.impl_ = (Impl *)internal::
                          ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                          operator*((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>
                                     *)in_stack_ffffffffffffff88);
    Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this_00.ptr_,
          (NumericExpr)in_stack_ffffffffffffffe0.impl_,(int)((ulong)other.ptr_ >> 0x20));
    internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
              ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
               &stack0xffffffffffffffd8);
    while (EVar3.ptr_ = other.ptr_,
          bVar1 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                  operator!=((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                             &stack0xffffffffffffffd8,
                             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)
                             other.ptr_), bVar1) {
      in_stack_ffffffffffffff88 = in_RDI->buffer_;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_RDI,(char *)in_stack_ffffffffffffff88);
      value_00.size_ = (size_t)EVar2.impl_;
      value_00.data_ = (char *)other.ptr_;
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value_00);
      internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator*
                ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                 in_stack_ffffffffffffff88);
      Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this_00.ptr_,
            (NumericExpr)in_stack_ffffffffffffffe0.impl_,(int)((ulong)EVar3.ptr_ >> 0x20));
      internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
                ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                 &stack0xffffffffffffffd8);
      other.ptr_ = EVar3.ptr_;
    }
  }
  fmt::BasicWriter<char>::operator<<(in_RDI,(char)((ulong)in_stack_ffffffffffffff88 >> 0x38));
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitSum(SumExpr e) {
  writer_ << "(";
  typename SumExpr::iterator i = e.begin(), end = e.end();
  if (i != end) {
    Visit(*i);
    for (++i; i != end; ++i) {
      writer_ << " + ";
      Visit(*i);
    }
  }
  writer_ << ')';
}